

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

int __thiscall
phmap::priv::
base_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
::verify(base_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
         *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  _Rb_tree_header *p_Var1;
  int extraout_EAX;
  int iVar2;
  int extraout_EAX_00;
  reference plVar3;
  long lVar4;
  _Rb_tree_node_base *p_Var5;
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
  *pbVar6;
  uint uVar7;
  char *pcVar8;
  const_iterator cVar9;
  AssertionResult AVar10;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
  tree_iter;
  const_reverse_iterator tree_riter;
  iterator checker_iter;
  reverse_iterator checker_riter;
  undefined1 local_b0 [8];
  int local_a8;
  undefined4 uStack_a4;
  undefined1 local_a0 [8];
  int iStack_98;
  undefined4 uStack_94;
  reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>_>
  local_90;
  undefined1 local_80 [8];
  int local_78;
  undefined4 uStack_74;
  AssertHelper local_70;
  _Rb_tree_const_iterator<long> local_68;
  _Rb_tree_const_iterator<long> local_60;
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
  *local_58;
  _Rb_tree_node_base *local_50;
  reverse_iterator<std::_Rb_tree_const_iterator<long>_> local_48;
  undefined8 uStack_40;
  
  btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>::verify
            ((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
              *)this,ctx,sig,siglen,tbs,tbslen);
  local_a0 = (undefined1  [8])
             (this->tree_).
             super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_>
             .tree_.size_;
  local_b0 = (undefined1  [8])(this->checker_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_80,"tree_.size()","checker_.size()",(unsigned_long *)local_a0,
             (unsigned_long *)local_b0);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if ((undefined8 *)CONCAT44(uStack_74,local_78) == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)CONCAT44(uStack_74,local_78);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x112,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_a0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_a0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_74,local_78) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_74,local_78));
  }
  local_68._M_node = (this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cVar9 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
          ::begin((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                   *)this);
  local_80[0] = cVar9.node._0_1_;
  local_80._1_7_ = cVar9.node._1_7_;
  local_78 = cVar9.position;
  cVar9 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
          ::end((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                 *)this);
  pbVar6 = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
            *)CONCAT71(local_80._1_7_,local_80[0]);
  if (local_78 != cVar9.position || pbVar6 != cVar9.node) {
    do {
      if (((ulong)pbVar6 & 7) != 0) {
        __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                      ,0xf84,
                      "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>> *, unsigned char, long, phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>> *, unsigned char, long, phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                     );
      }
      if (*(long *)(pbVar6 + (long)local_78 * 8 + 0x10) != *(long *)(local_68._M_node + 1))
      goto LAB_001ea644;
      btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
      ::increment((btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
                   *)local_80);
      local_68._M_node = (_Base_ptr)std::_Rb_tree_increment(local_68._M_node);
      cVar9 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
              ::end((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                     *)this);
      pbVar6 = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                *)CONCAT71(local_80._1_7_,local_80[0]);
    } while (local_78 != cVar9.position || pbVar6 != cVar9.node);
  }
  iVar2 = (int)(this->tree_).
               super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_>
               .
               super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_>
               .tree_.size_;
  if (0 < iVar2) {
    uVar7 = iVar2 + 1;
    do {
      tree_iter.node._1_7_ = local_80._1_7_;
      tree_iter.node._0_1_ = local_80[0];
      tree_iter.position = local_78;
      tree_iter._12_4_ = 0;
      base_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>
      ::
      iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>const,long_const&,long_const*>,std::_Rb_tree_const_iterator<long>>
                ((base_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>
                  *)this,tree_iter,local_68);
      btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
      ::decrement((btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
                   *)local_80);
      local_68._M_node = (_Base_ptr)std::_Rb_tree_decrement(local_68._M_node);
      uVar7 = uVar7 - 1;
    } while (1 < uVar7);
  }
  cVar9 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
          ::begin((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                   *)this);
  local_b0 = (undefined1  [8])cVar9.node;
  local_a8 = cVar9.position;
  testing::internal::
  CmpHelperEQ<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>const,long_const&,long_const*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>const,long_const&,long_const*>>
            ((internal *)local_a0,"tree_iter","tree_.begin()",
             (btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
              *)local_80,
             (btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
              *)local_b0);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b0);
    if ((undefined8 *)CONCAT44(uStack_94,iStack_98) == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)CONCAT44(uStack_94,iStack_98);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x121,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (local_b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_94,iStack_98) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&iStack_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,iStack_98));
  }
  local_b0 = (undefined1  [8])(this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_const_iterator<long>,std::_Rb_tree_const_iterator<long>>
            ((internal *)local_a0,"checker_iter","checker_.begin()",&local_68,
             (_Rb_tree_const_iterator<long> *)local_b0);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b0);
    if ((undefined8 *)CONCAT44(uStack_94,iStack_98) == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)CONCAT44(uStack_94,iStack_98);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x122,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (local_b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_94,iStack_98) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&iStack_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,iStack_98));
  }
  p_Var1 = &(this->checker_)._M_t._M_impl.super__Rb_tree_header;
  local_60._M_node = &p_Var1->_M_header;
  cVar9 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
          ::end((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                 *)this);
  local_a0 = (undefined1  [8])cVar9.node;
  iStack_98 = cVar9.position;
  cVar9 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
          ::begin((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                   *)this);
  p_Var5 = &p_Var1->_M_header;
  if ((local_a0 != (undefined1  [8])cVar9.node) || (iStack_98 != cVar9.position)) {
    do {
      plVar3 = std::
               reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>_>
               ::operator*((reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>_>
                            *)local_a0);
      lVar4 = std::_Rb_tree_decrement(p_Var5);
      if (*plVar3 != *(long *)(lVar4 + 0x20)) {
LAB_001ea644:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                      ,0x49,
                      "void phmap::priv::(anonymous namespace)::CheckPairEquals(const T &, const U &) [T = long, U = long]"
                     );
      }
      btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
      ::decrement((btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
                   *)local_a0);
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var5);
      local_60._M_node = p_Var5;
      cVar9 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
              ::begin((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                       *)this);
    } while ((local_a0 != (undefined1  [8])cVar9.node) || (iStack_98 != cVar9.position));
  }
  iVar2 = (int)(this->tree_).
               super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_>
               .
               super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_>
               .tree_.size_;
  local_58 = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
              *)p_Var1;
  if (0 < iVar2) {
    uVar7 = iVar2 + 1;
    do {
      uStack_40 = CONCAT44(uStack_94,iStack_98);
      local_48.current._M_node =
           (_Rb_tree_const_iterator<long>)(_Rb_tree_const_iterator<long>)local_a0;
      local_50 = p_Var5;
      base_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>
      ::
      riter_check<std::reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>const,long_const&,long_const*>>,std::reverse_iterator<std::_Rb_tree_const_iterator<long>>>
                ((base_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>
                  *)local_b0,
                 (reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>_>
                  *)this,&local_48);
      btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
      ::increment((btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
                   *)local_a0);
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      uVar7 = uVar7 - 1;
      local_60._M_node = p_Var5;
    } while (1 < uVar7);
  }
  cVar9 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
          ::end((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                 *)this);
  local_90.current.node = cVar9.node;
  local_90.current.position = cVar9.position;
  testing::internal::
  CmpHelperEQ<std::reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>const,long_const&,long_const*>>,std::reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>const,long_const&,long_const*>>>
            ((internal *)local_b0,"tree_riter","tree_.rbegin()",
             (reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>_>
              *)local_a0,&local_90);
  pbVar6 = local_58;
  if (local_b0[0] ==
      (base_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>
       )0x0) {
    testing::Message::Message((Message *)&local_90);
    if ((undefined8 *)CONCAT44(uStack_a4,local_a8) == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)CONCAT44(uStack_a4,local_a8);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x131,pcVar8);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_90.current.node !=
        (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_90.current.node + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_a4,local_a8) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_a4,local_a8));
  }
  local_90.current.node = pbVar6;
  AVar10 = testing::internal::
           CmpHelperEQ<std::reverse_iterator<std::_Rb_tree_const_iterator<long>>,std::reverse_iterator<std::_Rb_tree_const_iterator<long>>>
                     ((internal *)local_b0,"checker_riter","checker_.rbegin()",
                      (reverse_iterator<std::_Rb_tree_const_iterator<long>_> *)&local_60,
                      (reverse_iterator<std::_Rb_tree_const_iterator<long>_> *)&local_90);
  iVar2 = AVar10._0_4_;
  if (local_b0[0] ==
      (base_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>
       )0x0) {
    testing::Message::Message((Message *)&local_90);
    if ((undefined8 *)CONCAT44(uStack_a4,local_a8) == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)CONCAT44(uStack_a4,local_a8);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x132,pcVar8);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    iVar2 = extraout_EAX;
    if (local_90.current.node !=
        (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
         *)0x0) {
      iVar2 = (**(code **)(*(long *)local_90.current.node + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_a4,local_a8) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_a4,local_a8));
    iVar2 = extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

void verify() const {
        tree_.verify();
        EXPECT_EQ(tree_.size(), checker_.size());

        // Move through the forward iterators using increment.
        auto checker_iter = checker_.begin();
        const_iterator tree_iter(tree_.begin());
        for (; tree_iter != tree_.end(); ++tree_iter, ++checker_iter) {
            CheckPairEquals(*tree_iter, *checker_iter);
        }

        // Move through the forward iterators using decrement.
        for (int n = (int)tree_.size() - 1; n >= 0; --n) {
            iter_check(tree_iter, checker_iter);
            --tree_iter;
            --checker_iter;
        }
        EXPECT_EQ(tree_iter, tree_.begin());
        EXPECT_EQ(checker_iter, checker_.begin());

        // Move through the reverse iterators using increment.
        auto checker_riter = checker_.rbegin();
        const_reverse_iterator tree_riter(tree_.rbegin());
        for (; tree_riter != tree_.rend(); ++tree_riter, ++checker_riter) {
            CheckPairEquals(*tree_riter, *checker_riter);
        }

        // Move through the reverse iterators using decrement.
        for (int n = (int)tree_.size() - 1; n >= 0; --n) {
            riter_check(tree_riter, checker_riter);
            --tree_riter;
            --checker_riter;
        }
        EXPECT_EQ(tree_riter, tree_.rbegin());
        EXPECT_EQ(checker_riter, checker_.rbegin());
    }